

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall node::anon_unknown_2::NodeImpl::isLoadingBlocks(NodeImpl *this)

{
  long lVar1;
  ChainstateManager *pCVar2;
  byte bVar3;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_context->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x1a6,"chainman","m_context->chainman");
  pCVar2 = (puVar4->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  bVar3 = 1;
  if (((pCVar2->m_blockman).m_importing._M_base._M_i & 1U) == 0) {
    bVar3 = (pCVar2->m_blockman).m_blockfiles_indexed._M_base._M_i ^ 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool isLoadingBlocks() override { return chainman().m_blockman.LoadingBlocks(); }